

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O1

uchar __thiscall IDisk::GetNextBit(IDisk *this,int side,int track)

{
  uchar *puVar1;
  ILog *pIVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  Side *pSVar9;
  
  puVar1 = this->side_[side].tracks[track].bitfield;
  if (puVar1 == (uchar *)0x0) {
    iVar4 = rand();
    bVar8 = (byte)iVar4 & 1;
  }
  else {
    bVar7 = puVar1[this->head_position_];
    if ((bVar7 & 0xf2) != 0) {
      if (this->log_ != (ILog *)0x0) {
        (**(code **)(*(long *)this->log_ + 0x18))();
      }
      pIVar2 = this->log_;
      if (pIVar2 != (ILog *)0x0) {
        (**(code **)(*(long *)pIVar2 + 0x18))(pIVar2,bVar7);
      }
      bVar7 = bVar7 & 0xd;
      pIVar2 = this->log_;
      if (pIVar2 != (ILog *)0x0) {
        (**(code **)(*(long *)pIVar2 + 0x18))(pIVar2,bVar7);
      }
    }
    pSVar9 = this->side_ + side;
    bVar8 = bVar7 | 2;
    if (1 < this->head_position_) {
      bVar8 = bVar7;
    }
    if ((bVar8 & 8) != 0) {
      uVar3 = rand();
      if ((uVar3 & 1) != 0) {
        uVar3 = this->head_position_ + 1;
        this->head_position_ = uVar3;
        uVar6 = 0;
        if (uVar3 < pSVar9->tracks[track].size) {
          uVar6 = (ulong)uVar3;
        }
        this->head_position_ = (uint)uVar6;
        bVar8 = bVar8 & 2 | pSVar9->tracks[track].bitfield[uVar6];
      }
    }
    if ((bVar8 & 4) != 0) {
      iVar4 = rand();
      bVar8 = bVar8 & 2 | (byte)iVar4 & 1;
    }
    uVar5 = this->head_position_ + 1;
    this->head_position_ = uVar5;
    uVar3 = 0;
    if (uVar5 < pSVar9->tracks[track].size) {
      uVar3 = uVar5;
    }
    this->head_position_ = uVar3;
    bVar8 = bVar8 & 3;
  }
  return bVar8;
}

Assistant:

unsigned char IDisk::GetNextBit(int side, int track)
{
   // Sanity check
   if (side_[side].tracks[track].bitfield == nullptr)
   {
      return (rand() & 0x1);
   }

   unsigned char value = side_[side].tracks[track].bitfield[head_position_];

   if (value & 0xF2)
   {
      // SOMETHING STRANGE ! - Lots of error if this is not removed !!!
      LOG(head_position_);
      LOG(value);
      value &= 0x0D;
      LOG(value);
   }
   if (head_position_ < 2)
      value |= BIT_INDEX;

   // Return current bit (0 = index)
   if ((value & BIT_OPTIONAL) == BIT_OPTIONAL)
   {
      bool one_more;
      
      {
         one_more = rand() & 0x1;
      }
      
      if (one_more)
      {
         ++head_position_;
         if (head_position_ >= side_[side].tracks[track].size)
         {
            head_position_ = 0;
         }
         value = side_[side].tracks[track].bitfield[head_position_] | (value & BIT_INDEX);
      }
   }

   if ((value & BIT_WEAK) == BIT_WEAK)
   {
      value = (rand() & 0x1) | (value & BIT_INDEX);
   }

   // Get next bit
   ++head_position_;
   if (head_position_ >= side_[side].tracks[track].size)
   {
      head_position_ = 0;
   }

   return (value & 0x3);
}